

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O2

void __thiscall
Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
          (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this)

{
  internal::
  LU_GlobalLU_t<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
  ~LU_GlobalLU_t(&this->m_glu);
  DenseStorage<int,_-1,_-1,_1,_0>::~DenseStorage((DenseStorage<int,__1,__1,_1,_0> *)&this->m_etree);
  DenseStorage<int,_-1,_-1,_1,_0>::~DenseStorage((DenseStorage<int,__1,__1,_1,_0> *)&this->m_perm_r)
  ;
  DenseStorage<int,_-1,_-1,_1,_0>::~DenseStorage((DenseStorage<int,__1,__1,_1,_0> *)&this->m_perm_c)
  ;
  SparseMatrix<double,_0,_int>::~SparseMatrix(&this->m_mat);
  std::__cxx11::string::~string((string *)&this->m_lastError);
  return;
}

Assistant:

~SparseLU()
    {
      // Free all explicit dynamic pointers 
    }